

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

String * Json::toHex16Bit_abi_cxx11_(uint x)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  uint in_ESI;
  String *in_RDI;
  uint lo;
  uint hi;
  String *result;
  allocator local_16;
  undefined1 local_15;
  uint local_14;
  uint local_10;
  
  local_10 = in_ESI >> 8 & 0xff;
  local_14 = in_ESI & 0xff;
  local_15 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,4,' ',&local_16);
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  uVar1 = hex2[local_10 * 2];
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *puVar2 = uVar1;
  uVar1 = hex2[(ulong)(local_10 * 2) + 1];
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *puVar2 = uVar1;
  uVar1 = hex2[local_14 * 2];
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *puVar2 = uVar1;
  uVar1 = hex2[(ulong)(local_14 * 2) + 1];
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *puVar2 = uVar1;
  return in_RDI;
}

Assistant:

static String toHex16Bit(unsigned int x) {
  const unsigned int hi = (x >> 8) & 0xff;
  const unsigned int lo = x & 0xff;
  String result(4, ' ');
  result[0] = hex2[2 * hi];
  result[1] = hex2[2 * hi + 1];
  result[2] = hex2[2 * lo];
  result[3] = hex2[2 * lo + 1];
  return result;
}